

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O0

void D_AddConfigWads(TArray<FString,_FString> *wadfiles,char *section)

{
  char *wadfiles_00;
  bool bVar1;
  int iVar2;
  char *value_00;
  FString local_40;
  undefined1 local_38 [8];
  Position pos;
  char *value;
  char *key;
  char *section_local;
  TArray<FString,_FString> *wadfiles_local;
  
  key = section;
  section_local = (char *)wadfiles;
  bVar1 = FConfigFile::SetSection(&GameConfig->super_FConfigFile,section,false);
  if (bVar1) {
    while (bVar1 = FConfigFile::NextInSection
                             (&GameConfig->super_FConfigFile,&value,(char **)&pos.Entry), bVar1) {
      iVar2 = strcasecmp(value,"Path");
      if (iVar2 == 0) {
        FConfigFile::GetPosition(&GameConfig->super_FConfigFile,(Position *)local_38);
        wadfiles_00 = section_local;
        ExpandEnvVars((char *)&local_40);
        value_00 = FString::operator_cast_to_char_(&local_40);
        D_AddWildFile((TArray<FString,_FString> *)wadfiles_00,value_00);
        FString::~FString(&local_40);
        FConfigFile::SetPosition(&GameConfig->super_FConfigFile,(Position *)local_38);
      }
    }
  }
  return;
}

Assistant:

void D_AddConfigWads (TArray<FString> &wadfiles, const char *section)
{
	if (GameConfig->SetSection (section))
	{
		const char *key;
		const char *value;
		FConfigFile::Position pos;

		while (GameConfig->NextInSection (key, value))
		{
			if (stricmp (key, "Path") == 0)
			{
				// D_AddWildFile resets GameConfig's position, so remember it
				GameConfig->GetPosition (pos);
				D_AddWildFile (wadfiles, ExpandEnvVars(value));
				// Reset GameConfig's position to get next wad
				GameConfig->SetPosition (pos);
			}
		}
	}
}